

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O2

Status __thiscall
leveldb::BlockConstructor::FinishImpl(BlockConstructor *this,Options *options,KVMap *data)

{
  _Rb_tree_node_base *p_Var1;
  Block *pBVar2;
  long in_RCX;
  Slice local_c8;
  string local_b8;
  BlockBuilder builder;
  
  pBVar2 = (Block *)options[1].comparator;
  if (pBVar2 != (Block *)0x0) {
    Block::~Block(pBVar2);
  }
  operator_delete(pBVar2);
  options[1].comparator = (Comparator *)0x0;
  BlockBuilder::BlockBuilder(&builder,(Options *)data);
  for (p_Var1 = *(_Rb_tree_node_base **)(in_RCX + 0x18);
      p_Var1 != (_Rb_tree_node_base *)(in_RCX + 8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    local_b8._M_dataplus._M_p = *(pointer *)(p_Var1 + 1);
    local_b8._M_string_length = (size_type)p_Var1[1]._M_parent;
    local_c8 = *(Slice *)(p_Var1 + 2);
    BlockBuilder::Add(&builder,(Slice *)&local_b8,&local_c8);
  }
  local_c8 = BlockBuilder::Finish(&builder);
  Slice::ToString_abi_cxx11_(&local_b8,&local_c8);
  std::__cxx11::string::operator=((string *)&options->block_restart_interval,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  local_b8._M_dataplus._M_p = *(pointer *)&options->block_restart_interval;
  local_b8._M_string_length = options->max_file_size;
  local_b8.field_2._M_allocated_capacity._0_2_ = 0;
  pBVar2 = (Block *)operator_new(0x18);
  Block::Block(pBVar2,(BlockContents *)&local_b8);
  options[1].comparator = (Comparator *)pBVar2;
  (this->super_Constructor)._vptr_Constructor = (_func_int **)0x0;
  BlockBuilder::~BlockBuilder(&builder);
  return (Status)(char *)this;
}

Assistant:

Status FinishImpl(const Options& options, const KVMap& data) override {
    delete block_;
    block_ = nullptr;
    BlockBuilder builder(&options);

    for (const auto& kvp : data) {
      builder.Add(kvp.first, kvp.second);
    }
    // Open the block
    data_ = builder.Finish().ToString();
    BlockContents contents;
    contents.data = data_;
    contents.cachable = false;
    contents.heap_allocated = false;
    block_ = new Block(contents);
    return Status::OK();
  }